

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O1

Vec_Ptr_t * Mpm_ManFindCells(Mio_Library_t *pMio,SC_Lib *pScl,Vec_Wec_t *vNpnConfigs)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *__ptr;
  void **__s;
  Mio_Gate_t *pMVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = vNpnConfigs->nSize;
  __ptr = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  __ptr->nSize = 0;
  __ptr->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar4 << 3);
  }
  __ptr->pArray = __s;
  __ptr->nSize = iVar1;
  memset(__s,0,(long)iVar1 * 8);
  if (0 < vNpnConfigs->nSize) {
    lVar5 = 1;
    lVar6 = 0;
    do {
      iVar4 = *(int *)((long)vNpnConfigs->pArray + lVar5 * 8 + -4);
      if (iVar4 != 0) {
        if (iVar4 < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = **(int **)(&vNpnConfigs->pArray->nCap + lVar5 * 2) >> 0x11;
        if (((int)uVar2 < 0) || ((pScl->vCells).nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pMVar3 = Mio_LibraryReadGateByName(pMio,*(pScl->vCells).pArray[uVar2],(char *)0x0);
        if (pMVar3 == (Mio_Gate_t *)0x0) {
          if (__s != (void **)0x0) {
            free(__s);
            __ptr->pArray = (void **)0x0;
          }
          free(__ptr);
          return (Vec_Ptr_t *)0x0;
        }
        if (iVar1 <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[lVar6] = pMVar3;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 2;
    } while (lVar6 < vNpnConfigs->nSize);
  }
  return __ptr;
}

Assistant:

Vec_Ptr_t * Mpm_ManFindCells( Mio_Library_t * pMio, SC_Lib * pScl, Vec_Wec_t * vNpnConfigs )
{
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vClass;
    Mio_Gate_t * pMioGate;
    SC_Cell * pCell;
    int Config, iClass;
    vNpnGatesMio = Vec_PtrStart( Vec_WecSize(vNpnConfigs) );
    Vec_WecForEachLevel( vNpnConfigs, vClass, iClass )
    {
        if ( Vec_IntSize(vClass) == 0 )
            continue;
        Config = Vec_IntEntry(vClass, 0);
        pCell = SC_LibCell( pScl, (Config >> 17) );
        pMioGate = Mio_LibraryReadGateByName( pMio, pCell->pName, NULL );
        if ( pMioGate == NULL )
        {
            Vec_PtrFree( vNpnGatesMio );
            return NULL;
        }
        assert( pMioGate != NULL );
        Vec_PtrWriteEntry( vNpnGatesMio, iClass, pMioGate );
    }
    return vNpnGatesMio;
}